

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__GetGlyphInfoT2(stbtt_fontinfo *info,int glyph_index,int *x0,int *y0,int *x1,int *y1)

{
  int iVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_R8;
  undefined4 *in_R9;
  int r;
  stbtt__csctx c;
  stbtt__csctx *in_stack_00000208;
  int in_stack_00000214;
  stbtt_fontinfo *in_stack_00000218;
  int local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_68 [6];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  int local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  memset(local_68,0,0x38);
  local_68[0] = 1;
  iVar1 = stbtt__run_charstring(in_stack_00000218,in_stack_00000214,in_stack_00000208);
  if (local_18 != (undefined4 *)0x0) {
    if (iVar1 == 0) {
      local_70 = 0;
    }
    else {
      local_70 = local_50;
    }
    *local_18 = local_70;
  }
  if (local_20 != (undefined4 *)0x0) {
    if (iVar1 == 0) {
      local_74 = 0;
    }
    else {
      local_74 = local_48;
    }
    *local_20 = local_74;
  }
  if (local_28 != (undefined4 *)0x0) {
    if (iVar1 == 0) {
      local_78 = 0;
    }
    else {
      local_78 = local_4c;
    }
    *local_28 = local_78;
  }
  if (local_30 != (undefined4 *)0x0) {
    if (iVar1 == 0) {
      local_7c = 0;
    }
    else {
      local_7c = local_44;
    }
    *local_30 = local_7c;
  }
  if (iVar1 == 0) {
    local_80 = 0;
  }
  else {
    local_80 = local_38;
  }
  return local_80;
}

Assistant:

static int stbtt__GetGlyphInfoT2(const stbtt_fontinfo *info, int glyph_index, int *x0, int *y0, int *x1, int *y1)
{
   stbtt__csctx c = STBTT__CSCTX_INIT(1);
   int r = stbtt__run_charstring(info, glyph_index, &c);
   if (x0)  *x0 = r ? c.min_x : 0;
   if (y0)  *y0 = r ? c.min_y : 0;
   if (x1)  *x1 = r ? c.max_x : 0;
   if (y1)  *y1 = r ? c.max_y : 0;
   return r ? c.num_vertices : 0;
}